

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

regex_stack_entry * __thiscall CRegexStack::get_frame(CRegexStack *this,int depth)

{
  int in_ESI;
  CRegexStack *in_RDI;
  regex_stack_entry *fp;
  regex_stack_entry *local_18;
  int local_c;
  
  local_c = in_ESI;
  for (local_18 = (regex_stack_entry *)(in_RDI->buf_ + in_RDI->sp_);
      local_c != 0 && local_18 != (regex_stack_entry *)0x0;
      local_18 = get_parent_frame(in_RDI,local_18)) {
    local_c = local_c + -1;
  }
  return local_18;
}

Assistant:

regex_stack_entry *get_frame(int depth)
    {
        /* traverse the given number of frames from the top of the stack */
        regex_stack_entry *fp;
        for (fp = (regex_stack_entry *)(buf_ + sp_) ;
             depth != 0 && fp != 0 ; --depth, fp = get_parent_frame(fp)) ;

        /* return the frame pointer */
        return fp;
    }